

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyRandomness(SyPRNGCtx *pCtx,void *pBuf,sxu32 nLen)

{
  sxu8 sVar1;
  sxi32 in_EAX;
  undefined3 extraout_var;
  undefined3 extraout_var_00;
  undefined3 extraout_var_01;
  undefined3 extraout_var_02;
  uchar *zBuf;
  sxu8 *psVar2;
  
  if (pCtx->nMagic == 0x13c4) {
    psVar2 = (sxu8 *)((ulong)nLen + (long)pBuf);
    for (; pBuf < psVar2; pBuf = (void *)((long)pBuf + 4)) {
      sVar1 = randomByte(pCtx);
      *(sxu8 *)pBuf = sVar1;
      if (psVar2 <= (sxu8 *)((long)pBuf + 1)) {
        return CONCAT31(extraout_var,sVar1);
      }
      sVar1 = randomByte(pCtx);
      *(sxu8 *)((long)pBuf + 1) = sVar1;
      if (psVar2 <= (sxu8 *)((long)pBuf + 2)) {
        return CONCAT31(extraout_var_00,sVar1);
      }
      sVar1 = randomByte(pCtx);
      *(sxu8 *)((long)pBuf + 2) = sVar1;
      if (psVar2 <= (sxu8 *)((long)pBuf + 3)) {
        return CONCAT31(extraout_var_01,sVar1);
      }
      sVar1 = randomByte(pCtx);
      in_EAX = CONCAT31(extraout_var_02,sVar1);
      *(sxu8 *)((long)pBuf + 3) = sVar1;
    }
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomness(SyPRNGCtx *pCtx, void *pBuf, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)pBuf;
	unsigned char *zEnd = &zBuf[nLen];
#if defined(UNTRUST)
	if( pCtx == 0 || pBuf == 0 || nLen <= 0 ){
		return SXERR_EMPTY;
	}
#endif
	if(pCtx->nMagic != SXPRNG_MAGIC ){
		return SXERR_CORRUPT;
	}
	for(;;){
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
	}
	return SXRET_OK;  
}